

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateModule(ExpressionEvalContext *ctx,ExprModule *expression)

{
  StackVariable *__s;
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *this;
  Allocator *pAVar1;
  ExprBase *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  StackFrame **ppSVar5;
  ExprBase *pEVar6;
  IntrusiveList<ExprBase> *pIVar7;
  StackFrame *pSVar4;
  
  iVar3 = (*ctx->ctx->allocator->_vptr_Allocator[2])();
  pSVar4 = (StackFrame *)CONCAT44(extraout_var,iVar3);
  pAVar1 = ctx->ctx->allocator;
  pSVar4->owner = (FunctionData *)0x0;
  __s = (pSVar4->variables).little;
  memset(__s,0,0x200);
  (pSVar4->variables).allocator = pAVar1;
  (pSVar4->variables).data = __s;
  (pSVar4->variables).count = 0;
  (pSVar4->variables).max = 0x20;
  pSVar4->continueDepth = 0;
  pSVar4->returnValue = (ExprBase *)0x0;
  pSVar4->targetYield = 0;
  pSVar4->breakDepth = 0;
  ctx->globalFrame = pSVar4;
  this = &ctx->stackFrames;
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::push_back(this,&ctx->globalFrame);
  ppSVar5 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(this);
  pSVar4 = *ppSVar5;
  pIVar7 = &expression->setup;
  while (pEVar2 = pIVar7->head, pEVar2 != (ExprBase *)0x0) {
    pEVar6 = Evaluate(ctx,pEVar2);
    pIVar7 = (IntrusiveList<ExprBase> *)&pEVar2->next;
    if (pEVar6 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
  }
  pIVar7 = &expression->expressions;
  while( true ) {
    pEVar2 = pIVar7->head;
    if (pEVar2 == (ExprBase *)0x0) {
      SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::pop_back(this);
      if ((ctx->stackFrames).count == 0) {
        return (ExprBase *)0x0;
      }
      __assert_fail("ctx.stackFrames.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0xc5b,"ExprBase *EvaluateModule(ExpressionEvalContext &, ExprModule *)");
    }
    pEVar6 = Evaluate(ctx,pEVar2);
    if (pEVar6 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    if ((pSVar4->breakDepth != 0) || (pSVar4->continueDepth != 0)) break;
    pIVar7 = (IntrusiveList<ExprBase> *)&pEVar2->next;
    if (pSVar4->returnValue != (ExprBase *)0x0) {
      return pSVar4->returnValue;
    }
  }
  __assert_fail("frame->breakDepth == 0 && frame->continueDepth == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                ,0xc53,"ExprBase *EvaluateModule(ExpressionEvalContext &, ExprModule *)");
}

Assistant:

ExprBase* EvaluateModule(ExpressionEvalContext &ctx, ExprModule *expression)
{
	ctx.globalFrame = new (ctx.ctx.get<ExpressionEvalContext::StackFrame>()) ExpressionEvalContext::StackFrame(ctx.ctx.allocator, NULL);
	ctx.stackFrames.push_back(ctx.globalFrame);

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	for(ExprBase *value = expression->setup.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;
	}

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;

		assert(frame->breakDepth == 0 && frame->continueDepth == 0);

		if(frame->returnValue)
			return frame->returnValue;
	}

	ctx.stackFrames.pop_back();

	assert(ctx.stackFrames.empty());

	return NULL;
}